

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_tests.cpp
# Opt level: O2

void density_tests::lifo_test_thread_proc
               (QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_depth,size_t i_fork_depth)

{
  anon_class_24_3_86bce9c5 do_tests;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  do_tests.std_rand = &i_random->m_rand;
  do_tests.i_depth = i_depth;
  do_tests.i_fork_depth = i_fork_depth;
  if ((i_flags & eTestExceptions) == eNone) {
    lifo_test_thread_proc::anon_class_24_3_86bce9c5::operator()(&do_tests);
  }
  else {
    local_18 = (code *)0x0;
    pcStack_10 = (code *)0x0;
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_28._M_unused._M_object = operator_new(0x18);
    *(size_t *)((long)local_28._M_unused._0_8_ + 0x10) = do_tests.i_fork_depth;
    *(mt19937 **)local_28._M_unused._0_8_ = do_tests.std_rand;
    *(size_t *)((long)local_28._M_unused._0_8_ + 8) = do_tests.i_depth;
    pcStack_10 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lifo_tests.cpp:277:25)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lifo_tests.cpp:277:25)>
               ::_M_manager;
    run_exception_test((function<void_()> *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  return;
}

Assistant:

void lifo_test_thread_proc(
      QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_depth, size_t i_fork_depth)
    {
        const auto & std_rand = i_random.underlying_rand();

        // local function that executes the tests
        auto do_tests = [&std_rand, i_depth, i_fork_depth] {
            auto rand_copy = std_rand;
            RecursiveLifoTests::recursive_test(rand_copy, i_depth, i_fork_depth);
        };

        // check if we should run the normal test or the exhaustive exception test
        if (i_flags && QueueTesterFlags::eTestExceptions)
        {
            run_exception_test(std::function<void()>(do_tests));
        }
        else
        {
            do_tests();
        }
    }